

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

int If_CluHashFindMedian(If_Man_t *p,int t)

{
  long lVar1;
  int *piVar2;
  uint uVar3;
  bool bVar4;
  uint *__ptr;
  void *pvVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  size_t __size;
  undefined8 *puVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar5 = malloc(4000);
  *(void **)(__ptr + 2) = pvVar5;
  __ptr[1] = 1000;
  if (pvVar5 != (void *)0x0) {
    memset(pvVar5,0,4000);
  }
  if (p->nTableSize[t] < 1) {
    uVar10 = 0;
    iVar8 = 0;
  }
  else {
    lVar7 = 0;
    iVar8 = 0;
    uVar10 = 0;
    do {
      for (puVar9 = (undefined8 *)p->pHashTable[t][lVar7]; puVar9 != (undefined8 *)0x0;
          puVar9 = (undefined8 *)*puVar9) {
        uVar13 = *(uint *)((long)puVar9 + 0xc);
        if ((int)uVar10 < (int)uVar13) {
          uVar10 = __ptr[1];
          if ((int)uVar10 <= (int)uVar13) {
            lVar1 = (ulong)uVar13 + 1;
            uVar3 = *__ptr;
            uVar12 = uVar3 * 2;
            uVar11 = (uint)lVar1;
            if ((int)uVar13 < (int)uVar12) {
              if (SBORROW4(uVar3,uVar12) != 0 < (int)uVar3 && (int)uVar3 <= (int)uVar13) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar5 = malloc((ulong)uVar12 << 2);
                }
                else {
                  pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar12 << 2);
                }
                *(void **)(__ptr + 2) = pvVar5;
LAB_00414f39:
                if (pvVar5 == (void *)0x0) {
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                *__ptr = uVar12;
              }
            }
            else if ((int)uVar3 <= (int)uVar13) {
              __size = lVar1 * 4;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar5 = malloc(__size);
              }
              else {
                pvVar5 = realloc(*(void **)(__ptr + 2),__size);
              }
              *(void **)(__ptr + 2) = pvVar5;
              uVar12 = uVar11;
              goto LAB_00414f39;
            }
            memset((void *)((long)(int)uVar10 * 4 + *(long *)(__ptr + 2)),0,
                   (ulong)(uVar13 - uVar10) * 4 + 4);
            __ptr[1] = uVar11;
          }
          if ((int)__ptr[1] <= (int)uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)(*(long *)(__ptr + 2) + (ulong)uVar13 * 4) = 0;
          uVar10 = uVar13;
        }
        iVar6 = *(int *)((long)puVar9 + 0xc);
        if (((long)iVar6 < 0) || ((int)__ptr[1] <= iVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar2 = (int *)(*(long *)(__ptr + 2) + (long)iVar6 * 4);
        *piVar2 = *piVar2 + 1;
        iVar8 = iVar8 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < p->nTableSize[t]);
    iVar8 = iVar8 / 2;
  }
  uVar13 = uVar10;
  if (0 < (int)uVar10) {
    iVar6 = 0;
    do {
      if ((int)__ptr[1] <= (int)uVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = iVar6 + *(int *)(*(long *)(__ptr + 2) + (ulong)uVar13 * 4);
      if (iVar8 < iVar6) goto LAB_00415018;
      bVar4 = 1 < (int)uVar13;
      uVar13 = uVar13 - 1;
    } while (bVar4);
    uVar13 = 0;
  }
LAB_00415018:
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  uVar10 = 1;
  if (1 < (int)uVar13) {
    uVar10 = uVar13;
  }
  return uVar10;
}

Assistant:

int If_CluHashFindMedian( If_Man_t * p, int t )
{
    If_Hte_t * pEntry;
    Vec_Int_t * vCounters;
    int i, Max = 0, Total = 0, Half = 0;
    vCounters = Vec_IntStart( 1000 );
    for ( i = 0; i < p->nTableSize[t]; i++ )
    {
        for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; pEntry = pEntry->pNext )
        {
            if ( Max < (int)pEntry->Counter )
            {
                Max = pEntry->Counter;
                Vec_IntSetEntry( vCounters, pEntry->Counter, 0 );
            }
            Vec_IntAddToEntry( vCounters, pEntry->Counter, 1 );
            Total++;
        }
    }
    for ( i = Max; i > 0; i-- )
    {
        Half += Vec_IntEntry( vCounters, i );
        if ( Half > Total/2 )
            break;
    }
/*
    printf( "total = %d  ", Total );
    printf( "half = %d  ", Half );
    printf( "i = %d  ", i );
    printf( "Max = %d.\n", Max );
*/
    Vec_IntFree( vCounters );
    return Abc_MaxInt( i, 1 );
}